

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O3

void __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setValue(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int i,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *x)

{
  uint *puVar1;
  pointer pnVar2;
  int *piVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int32_t iVar7;
  uint uVar8;
  int iVar9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_9c;
  cpp_dec_float<50U,_int,_void> local_98;
  cpp_dec_float<50U,_int,_void> local_58;
  
  if (this->setupStatus == true) {
    local_9c = i;
    uVar8 = IdxSet::pos(&this->super_IdxSet,i);
    if ((int)uVar8 < 0) {
      local_98.data._M_elems._32_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 8);
      local_98.data._M_elems._0_8_ = *(undefined8 *)(x->m_backend).data._M_elems;
      local_98.data._M_elems._8_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 2);
      local_98.data._M_elems._16_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 4);
      local_98.data._M_elems._24_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 6);
      local_98.exp = (x->m_backend).exp;
      local_98.neg = (x->m_backend).neg;
      uVar4._0_4_ = (x->m_backend).fpclass;
      uVar4._4_4_ = (x->m_backend).prec_elem;
      if ((local_98.neg == true) &&
         (local_98.data._M_elems[0] != 0 || (fpclass_type)uVar4 != cpp_dec_float_finite)) {
        local_98.neg = false;
      }
      local_98._48_8_ = uVar4;
      getEpsilon((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_58,this);
      if (((fpclass_type)uVar4 != cpp_dec_float_NaN) && (local_58.fpclass != cpp_dec_float_NaN)) {
        iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_98,&local_58);
        if (0 < iVar9) {
          IdxSet::add(&this->super_IdxSet,1,&local_9c);
          i = local_9c;
        }
      }
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_98,0,(type *)0x0);
      if (((x->m_backend).fpclass != cpp_dec_float_NaN) && (local_98.fpclass != cpp_dec_float_NaN))
      {
        iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&x->m_backend,&local_98);
        if (iVar9 == 0) {
          pnVar2 = (this->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar9 = (this->super_IdxSet).idx[uVar8];
          pnVar2[iVar9].m_backend.fpclass = cpp_dec_float_finite;
          pnVar2[iVar9].m_backend.prec_elem = 10;
          *(undefined1 (*) [16])&pnVar2[iVar9].m_backend.data = (undefined1  [16])0x0;
          puVar1 = (uint *)((long)&pnVar2[iVar9].m_backend.data + 0x10);
          puVar1[0] = 0;
          puVar1[1] = 0;
          puVar1[2] = 0;
          puVar1[3] = 0;
          *(undefined1 (*) [16])((long)&pnVar2[iVar9].m_backend.data + 0x1d) = (undefined1  [16])0x0
          ;
          piVar3 = (this->super_IdxSet).idx;
          iVar9 = (this->super_IdxSet).num;
          (this->super_IdxSet).num = iVar9 + -1;
          piVar3[uVar8] = piVar3[(long)iVar9 + -1];
        }
      }
    }
  }
  pnVar2 = (this->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((long)&pnVar2[i].m_backend.data + 0x20) =
       *(undefined8 *)((x->m_backend).data._M_elems + 8);
  uVar4 = *(undefined8 *)(x->m_backend).data._M_elems;
  uVar5 = *(undefined8 *)((x->m_backend).data._M_elems + 2);
  uVar6 = *(undefined8 *)((x->m_backend).data._M_elems + 6);
  puVar1 = (uint *)((long)&pnVar2[i].m_backend.data + 0x10);
  *(undefined8 *)puVar1 = *(undefined8 *)((x->m_backend).data._M_elems + 4);
  *(undefined8 *)(puVar1 + 2) = uVar6;
  *(undefined8 *)&pnVar2[i].m_backend.data = uVar4;
  *(undefined8 *)((long)&pnVar2[i].m_backend.data + 8) = uVar5;
  pnVar2[i].m_backend.exp = (x->m_backend).exp;
  pnVar2[i].m_backend.neg = (x->m_backend).neg;
  iVar7 = (x->m_backend).prec_elem;
  pnVar2[i].m_backend.fpclass = (x->m_backend).fpclass;
  pnVar2[i].m_backend.prec_elem = iVar7;
  return;
}

Assistant:

void setValue(int i, R x)
   {
      assert(i >= 0);
      assert(i < VectorBase<R>::dim());

      if(isSetup())
      {
         int n = pos(i);

         if(n < 0)
         {
            if(spxAbs(x) > this->getEpsilon())
               IdxSet::add(1, &i);
         }
         else if(x == R(0))
            clearNum(n);
      }

      VectorBase<R>::val[i] = x;

      assert(isConsistent());
   }